

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O3

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::KdTreeAggregate::Intersect
          (optional<pbrt::ShapeIntersection> *__return_storage_ptr__,KdTreeAggregate *this,Ray *ray,
          Float rayTMax)

{
  float *pfVar1;
  float *pfVar2;
  undefined1 (*pauVar3) [64];
  undefined1 (*pauVar4) [32];
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  int iVar10;
  ulong uVar11;
  uint uVar12;
  KdTreeNode *pKVar13;
  Ray *pRVar14;
  Vector3f *pVVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  Point3<float> *pPVar19;
  KdTreeNode *pKVar20;
  KdTreeNode *pKVar21;
  long in_FS_OFFSET;
  bool bVar22;
  undefined1 in_register_00001204 [60];
  Float t1;
  float fVar23;
  undefined1 auVar24 [64];
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  float fVar29;
  Float t0;
  undefined1 auVar30 [64];
  KdNodeToVisit toVisit [64];
  Float local_5a8;
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_540;
  char local_440;
  long lStack_438;
  float afStack_430 [256];
  
  auVar24._4_60_ = in_register_00001204;
  auVar24._0_4_ = rayTMax;
  pfVar1 = &(ray->o).super_Tuple3<pbrt::Point3,_float>.y;
  pfVar2 = &(ray->o).super_Tuple3<pbrt::Point3,_float>.z;
  auVar30 = ZEXT1664(ZEXT816(0) << 0x40);
  uVar16 = 0;
  fVar29 = 1.0 / (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar28 = 1.0 / (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar23 = 1.0 / (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
  bVar22 = false;
  auVar24 = ZEXT1664(auVar24._0_16_);
  do {
    auVar27 = ZEXT416((uint)(fVar29 * ((this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x -
                                      (ray->o).super_Tuple3<pbrt::Point3,_float>.x)));
    pPVar19 = &(this->bounds).pMax;
    pRVar14 = ray;
    fVar25 = fVar29;
    if ((uVar16 != 0) &&
       (auVar27 = ZEXT416((uint)(fVar28 * ((this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y -
                                          (ray->o).super_Tuple3<pbrt::Point3,_float>.y))),
       pPVar19 = (Point3<float> *)&(this->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y,
       pRVar14 = (Ray *)pfVar1, fVar25 = fVar28, uVar16 != 1)) {
      auVar27 = ZEXT416((uint)(fVar23 * ((this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z -
                                        (ray->o).super_Tuple3<pbrt::Point3,_float>.z)));
      pPVar19 = (Point3<float> *)&(this->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
      pRVar14 = (Ray *)pfVar2;
      fVar25 = fVar23;
    }
    auVar26 = ZEXT416((uint)(((pPVar19->super_Tuple3<pbrt::Point3,_float>).x -
                             (pRVar14->o).super_Tuple3<pbrt::Point3,_float>.x) * fVar25));
    auVar8 = vminss_avx(auVar26,auVar27);
    auVar27 = vmaxss_avx(auVar27,auVar26);
    auVar8 = vmaxss_avx(auVar8,auVar30._0_16_);
    auVar30 = ZEXT1664(auVar8);
    auVar27 = vminss_avx(ZEXT416((uint)(auVar27._0_4_ * 1.0000004)),auVar24._0_16_);
    auVar24 = ZEXT1664(auVar27);
    if (auVar27._0_4_ < auVar8._0_4_) {
      if (!bVar22) {
        auVar24 = ZEXT1264(ZEXT812(0));
        *(undefined8 *)&__return_storage_ptr__->set = 0;
        *(undefined1 (*) [64])((long)&__return_storage_ptr__->optionalValue + 0xc0) = auVar24;
        *(undefined1 (*) [64])((long)&__return_storage_ptr__->optionalValue + 0x80) = auVar24;
        *(undefined1 (*) [64])((long)&__return_storage_ptr__->optionalValue + 0x40) = auVar24;
        *(undefined1 (*) [64])&__return_storage_ptr__->optionalValue = auVar24;
        return __return_storage_ptr__;
      }
      break;
    }
    bVar22 = 1 < uVar16;
    uVar16 = uVar16 + 1;
  } while (uVar16 != 3);
  __return_storage_ptr__->set = false;
  uVar11 = 0;
  pKVar21 = this->nodes;
  if ((pKVar21 != (KdTreeNode *)0x0) && (auVar8._0_4_ <= rayTMax)) {
    pauVar3 = (undefined1 (*) [64])((long)&__return_storage_ptr__->optionalValue + 0x50);
    uVar11 = 0;
    uVar16 = 0;
    pauVar4 = (undefined1 (*) [32])((long)&__return_storage_ptr__->optionalValue + 0xd0);
    local_5a8 = rayTMax;
    do {
      uVar16 = uVar16 + 1;
      uVar12 = (pKVar21->field_1).flags & 3;
      iVar10 = (pKVar21->field_1).flags >> 2;
      iVar18 = (int)uVar11;
      if (uVar12 == 3) {
        if (iVar10 == 1) {
          PrimitiveHandle::Intersect
                    ((optional<pbrt::ShapeIntersection> *)&local_540.__align,
                     (this->primitives).
                     super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                     ._M_impl.super__Vector_impl_data._M_start + (pKVar21->field_0).onePrimitive,ray
                     ,local_5a8);
          if (local_440 == '\x01') {
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = local_540._64_8_;
            (__return_storage_ptr__->optionalValue).__align = local_540.__align;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = local_540._8_8_;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = local_540._16_8_;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = local_540._24_8_;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = local_540._32_8_;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = local_540._40_8_;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = local_540._48_8_;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = local_540._56_8_;
            auVar9._48_8_ = local_540._128_8_;
            auVar9._0_48_ = local_540._80_48_;
            auVar9._56_8_ = local_540._136_8_;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = local_540._72_8_;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = local_540._128_8_
            ;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = local_540._136_8_
            ;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = local_540._144_8_
            ;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) = local_540._152_8_
            ;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = local_540._160_8_
            ;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) = local_540._168_8_
            ;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) = local_540._176_8_
            ;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) = local_540._184_8_
            ;
            *pauVar3 = auVar9;
            *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0xc0) =
                 local_540._192_16_;
            local_5a8 = (Float)local_540._248_4_;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) = local_540._240_8_
            ;
            *pauVar4 = local_540._208_32_;
            *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0xf8) = local_540._248_4_
            ;
            __return_storage_ptr__->set = true;
          }
        }
        else if (0 < iVar10) {
          lVar17 = 0;
          do {
            PrimitiveHandle::Intersect
                      ((optional<pbrt::ShapeIntersection> *)&local_540.__align,
                       (this->primitives).
                       super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                       (this->primitiveIndices).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start
                       [(pKVar21->field_0).onePrimitive + lVar17],ray,local_5a8);
            if (local_440 == '\x01') {
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) =
                   local_540._64_8_;
              (__return_storage_ptr__->optionalValue).__align = local_540.__align;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = local_540._8_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) =
                   local_540._16_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
                   local_540._24_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) =
                   local_540._32_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) =
                   local_540._40_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) =
                   local_540._48_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) =
                   local_540._56_8_;
              auVar30._48_8_ = local_540._128_8_;
              auVar30._0_48_ = local_540._80_48_;
              auVar30._56_8_ = local_540._136_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) =
                   local_540._72_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) =
                   local_540._128_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) =
                   local_540._136_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) =
                   local_540._144_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) =
                   local_540._152_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) =
                   local_540._160_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) =
                   local_540._168_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) =
                   local_540._176_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) =
                   local_540._184_8_;
              *pauVar3 = auVar30;
              *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0xc0) =
                   local_540._192_16_;
              local_5a8 = (Float)local_540._248_4_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) =
                   local_540._240_8_;
              *pauVar4 = local_540._208_32_;
              *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0xf8) =
                   local_540._248_4_;
              __return_storage_ptr__->set = true;
            }
            lVar17 = lVar17 + 1;
          } while (iVar10 != (int)lVar17);
        }
        if (iVar18 < 1) goto LAB_003abf8b;
        uVar11 = (ulong)(iVar18 - 1);
        auVar30 = ZEXT464((uint)afStack_430[uVar11 * 4]);
        auVar24 = ZEXT464((uint)afStack_430[uVar11 * 4 + 1]);
        pKVar21 = (KdTreeNode *)(&lStack_438)[uVar11 * 2];
      }
      else {
        pRVar14 = ray;
        fVar25 = fVar29;
        if ((uVar12 != 0) && (pRVar14 = (Ray *)pfVar1, fVar25 = fVar28, uVar12 != 1)) {
          pRVar14 = (Ray *)pfVar2;
          fVar25 = fVar23;
        }
        fVar5 = (pKVar21->field_0).split;
        fVar6 = (pRVar14->o).super_Tuple3<pbrt::Point3,_float>.x;
        if (fVar6 < fVar5) {
LAB_003abdd4:
          pKVar20 = pKVar21 + 1;
          pKVar13 = this->nodes + iVar10;
        }
        else {
          pRVar14 = ray;
          if ((uVar12 != 0) && (pRVar14 = (Ray *)pfVar1, uVar12 != 1)) {
            pRVar14 = (Ray *)pfVar2;
          }
          fVar7 = (pRVar14->o).super_Tuple3<pbrt::Point3,_float>.x;
          if ((fVar7 == fVar5) && (!NAN(fVar7) && !NAN(fVar5))) {
            pVVar15 = &ray->d;
            if ((uVar12 != 0) &&
               (pVVar15 = (Vector3f *)&(ray->d).super_Tuple3<pbrt::Vector3,_float>.y, uVar12 != 1))
            {
              pVVar15 = (Vector3f *)&(ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
            }
            if ((pVVar15->super_Tuple3<pbrt::Vector3,_float>).x <= 0.0) goto LAB_003abdd4;
          }
          pKVar13 = pKVar21 + 1;
          pKVar20 = this->nodes + iVar10;
        }
        fVar25 = fVar25 * (fVar5 - fVar6);
        pKVar21 = pKVar20;
        if (((fVar25 <= auVar24._0_4_) && (0.0 < fVar25)) &&
           (pKVar21 = pKVar13, auVar30._0_4_ <= fVar25)) {
          lVar17 = (long)iVar18;
          uVar11 = (ulong)(iVar18 + 1);
          (&lStack_438)[lVar17 * 2] = (long)pKVar13;
          afStack_430[lVar17 * 4] = fVar25;
          afStack_430[lVar17 * 4 + 1] = auVar24._0_4_;
          auVar24 = ZEXT464((uint)fVar25);
          pKVar21 = pKVar20;
        }
      }
      if ((pKVar21 == (KdTreeNode *)0x0) || (local_5a8 < auVar30._0_4_)) goto LAB_003abf8b;
    } while( true );
  }
LAB_003abf8d:
  *(long *)(in_FS_OFFSET + -0x308) = *(long *)(in_FS_OFFSET + -0x308) + uVar11;
  return __return_storage_ptr__;
LAB_003abf8b:
  uVar11 = (ulong)uVar16;
  goto LAB_003abf8d;
}

Assistant:

pstd::optional<ShapeIntersection> KdTreeAggregate::Intersect(const Ray &ray,
                                                             Float rayTMax) const {
    // Compute initial parametric range of ray inside kd-tree extent
    Float tMin, tMax;
    if (!bounds.IntersectP(ray.o, ray.d, rayTMax, &tMin, &tMax))
        return {};

    // Prepare to traverse kd-tree for ray
    Vector3f invDir(1 / ray.d.x, 1 / ray.d.y, 1 / ray.d.z);
    constexpr int maxToVisit = 64;
    KdNodeToVisit toVisit[maxToVisit];
    int toVisitIndex = 0;
    int nodesVisited = 0;

    // Traverse kd-tree nodes in order for ray
    pstd::optional<ShapeIntersection> si;
    const KdTreeNode *node = &nodes[0];
    while (node != nullptr) {
        // Bail out if we found a hit closer than the current node
        if (rayTMax < tMin)
            break;

        ++nodesVisited;
        if (!node->IsLeaf()) {
            // Visit kd-tree interior node
            // Compute parametric distance along ray to split plane
            int axis = node->SplitAxis();
            Float tSplit = (node->SplitPos() - ray.o[axis]) * invDir[axis];

            // Get node children pointers for ray
            const KdTreeNode *firstChild, *secondChild;
            int belowFirst = (ray.o[axis] < node->SplitPos()) ||
                             (ray.o[axis] == node->SplitPos() && ray.d[axis] <= 0);
            if (belowFirst) {
                firstChild = node + 1;
                secondChild = &nodes[node->AboveChild()];
            } else {
                firstChild = &nodes[node->AboveChild()];
                secondChild = node + 1;
            }

            // Advance to next child node, possibly enqueue other child
            if (tSplit > tMax || tSplit <= 0)
                node = firstChild;
            else if (tSplit < tMin)
                node = secondChild;
            else {
                // Enqueue _secondChild_ in todo list
                toVisit[toVisitIndex].node = secondChild;
                toVisit[toVisitIndex].tMin = tSplit;
                toVisit[toVisitIndex].tMax = tMax;
                ++toVisitIndex;

                node = firstChild;
                tMax = tSplit;
            }

        } else {
            // Check for intersections inside leaf node
            int nPrimitives = node->nPrimitives();
            if (nPrimitives == 1) {
                const PrimitiveHandle &p = primitives[node->onePrimitive];
                // Check one primitive inside leaf node
                pstd::optional<ShapeIntersection> primSi = p.Intersect(ray, rayTMax);
                if (primSi) {
                    si = primSi;
                    rayTMax = si->tHit;
                }

            } else {
                for (int i = 0; i < nPrimitives; ++i) {
                    int index = primitiveIndices[node->primitiveIndicesOffset + i];
                    const PrimitiveHandle &p = primitives[index];
                    // Check one primitive inside leaf node
                    pstd::optional<ShapeIntersection> primSi = p.Intersect(ray, rayTMax);
                    if (primSi) {
                        si = primSi;
                        rayTMax = si->tHit;
                    }
                }
            }

            // Grab next node to visit from todo list
            if (toVisitIndex > 0) {
                --toVisitIndex;
                node = toVisit[toVisitIndex].node;
                tMin = toVisit[toVisitIndex].tMin;
                tMax = toVisit[toVisitIndex].tMax;
            } else
                break;
        }
    }
    kdNodesVisited += nodesVisited;
    return si;
}